

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O0

uint16_t aom_rb_read_primitive_quniform(aom_read_bit_buffer *rb,uint16_t n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ushort in_SI;
  int v;
  int m;
  int l;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffec;
  undefined2 local_2;
  
  if (in_SI < 2) {
    local_2 = 0;
  }
  else {
    iVar1 = get_msb((uint)in_SI);
    iVar1 = iVar1 + 1;
    iVar2 = (1 << ((byte)iVar1 & 0x1f)) - (uint)in_SI;
    iVar3 = aom_rb_read_literal((aom_read_bit_buffer *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
    if (iVar2 <= iVar3) {
      iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT26(in_SI,CONCAT24(in_stack_ffffffffffffffec,iVar1)));
      iVar3 = (iVar3 * 2 - iVar2) + iVar1;
    }
    local_2 = (uint16_t)iVar3;
  }
  return local_2;
}

Assistant:

static uint16_t aom_rb_read_primitive_quniform(struct aom_read_bit_buffer *rb,
                                               uint16_t n) {
  if (n <= 1) return 0;
  const int l = get_msb(n) + 1;
  const int m = (1 << l) - n;
  const int v = aom_rb_read_literal(rb, l - 1);
  return v < m ? v : (v << 1) - m + aom_rb_read_bit(rb);
}